

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RateLimiterTest.cpp
# Opt level: O1

void __thiscall
jaegertracing::utils::RateLimiter_testRateLimiter_Test::TestBody
          (RateLimiter_testRateLimiter_Test *this)

{
  bool bVar1;
  char cVar2;
  duration dVar3;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Da_03;
  undefined4 extraout_XMM0_Da_04;
  undefined4 extraout_XMM0_Da_05;
  undefined4 extraout_XMM0_Da_06;
  undefined4 extraout_XMM0_Da_07;
  undefined4 extraout_XMM0_Da_08;
  undefined4 extraout_XMM0_Da_09;
  undefined4 extraout_XMM0_Da_10;
  undefined4 extraout_XMM0_Da_11;
  undefined4 uVar4;
  undefined4 extraout_XMM0_Da_12;
  undefined4 extraout_XMM0_Da_13;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  undefined4 extraout_XMM0_Db_06;
  undefined4 extraout_XMM0_Db_07;
  undefined4 extraout_XMM0_Db_08;
  undefined4 extraout_XMM0_Db_09;
  undefined4 extraout_XMM0_Db_10;
  undefined4 extraout_XMM0_Db_11;
  undefined4 uVar5;
  undefined4 extraout_XMM0_Db_12;
  undefined4 extraout_XMM0_Db_13;
  AssertionResult gtest_ar_;
  RateLimiter<jaegertracing::utils::(anonymous_namespace)::MockClock> limiter;
  long *local_a8;
  AssertHelper local_a0 [8];
  char local_98 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_90;
  char *local_88 [2];
  char local_78 [16];
  RateLimiter<jaegertracing::utils::(anonymous_namespace)::MockClock> local_68;
  
  dVar3.__r = std::chrono::_V2::steady_clock::now();
  local_68._creditsPerSecond = 2.0;
  local_68._maxBalance = 2.0;
  local_68._balance = 2.0;
  local_68._mutex.super___mutex_base._M_mutex.__align = 0;
  local_68._mutex.super___mutex_base._M_mutex._8_8_ = 0;
  local_68._mutex.super___mutex_base._M_mutex._16_8_ = 0;
  local_68._mutex.super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  local_68._mutex.super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  _ZN13jaegertracing5utils12_GLOBAL__N_111currentTimeE_0.__r = dVar3.__r;
  local_68._lastTick.__d.__r = (duration)(duration)dVar3.__r;
  bVar1 = RateLimiter<jaegertracing::utils::(anonymous_namespace)::MockClock>::checkCredit
                    (&local_68,0.0);
  local_90.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_98[0] = bVar1;
  if (bVar1) {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_90,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    uVar4 = extraout_XMM0_Da;
    uVar5 = extraout_XMM0_Db;
  }
  else {
    testing::Message::Message((Message *)&local_a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_88,local_98,"limiter.checkCredit(1)","false");
    testing::internal::AssertHelper::AssertHelper
              (local_a0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/utils/RateLimiterTest.cpp"
               ,0x2f,local_88[0]);
    testing::internal::AssertHelper::operator=(local_a0,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(local_a0);
    if (local_88[0] != local_78) {
      operator_delete(local_88[0]);
    }
    if (local_a8 != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_a8 != (long *)0x0)) {
        (**(code **)(*local_a8 + 8))();
      }
      local_a8 = (long *)0x0;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_90,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    uVar4 = extraout_XMM0_Da_00;
    uVar5 = extraout_XMM0_Db_00;
    if (!bVar1) {
      return;
    }
  }
  bVar1 = RateLimiter<jaegertracing::utils::(anonymous_namespace)::MockClock>::checkCredit
                    (&local_68,(double)CONCAT44(uVar5,uVar4));
  local_90.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_98[0] = bVar1;
  if (bVar1) {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_90,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    uVar4 = extraout_XMM0_Da_01;
    uVar5 = extraout_XMM0_Db_01;
  }
  else {
    testing::Message::Message((Message *)&local_a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_88,local_98,"limiter.checkCredit(1)","false");
    testing::internal::AssertHelper::AssertHelper
              (local_a0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/utils/RateLimiterTest.cpp"
               ,0x30,local_88[0]);
    testing::internal::AssertHelper::operator=(local_a0,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(local_a0);
    if (local_88[0] != local_78) {
      operator_delete(local_88[0]);
    }
    if (local_a8 != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_a8 != (long *)0x0)) {
        (**(code **)(*local_a8 + 8))();
      }
      local_a8 = (long *)0x0;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_90,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    uVar4 = extraout_XMM0_Da_02;
    uVar5 = extraout_XMM0_Db_02;
    if (!bVar1) {
      return;
    }
  }
  bVar1 = RateLimiter<jaegertracing::utils::(anonymous_namespace)::MockClock>::checkCredit
                    (&local_68,(double)CONCAT44(uVar5,uVar4));
  local_98[0] = !bVar1;
  local_90.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((bool)local_98[0]) {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_90,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    _ZN13jaegertracing5utils12_GLOBAL__N_111currentTimeE_0.__r = dVar3.__r + 250000000;
    bVar1 = RateLimiter<jaegertracing::utils::(anonymous_namespace)::MockClock>::checkCredit
                      (&local_68,(double)CONCAT44(extraout_XMM0_Db_03,extraout_XMM0_Da_03));
    local_98[0] = !bVar1;
    local_90.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if ((bool)local_98[0]) {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_90,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      _ZN13jaegertracing5utils12_GLOBAL__N_111currentTimeE_0.__r = dVar3.__r + 750000000;
      bVar1 = RateLimiter<jaegertracing::utils::(anonymous_namespace)::MockClock>::checkCredit
                        (&local_68,(double)CONCAT44(extraout_XMM0_Db_04,extraout_XMM0_Da_04));
      local_90.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_98[0] = bVar1;
      if (bVar1) {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_90,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        uVar4 = extraout_XMM0_Da_05;
        uVar5 = extraout_XMM0_Db_05;
      }
      else {
        testing::Message::Message((Message *)&local_a8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((AssertionResult *)local_88,local_98,"limiter.checkCredit(1)","false");
        testing::internal::AssertHelper::AssertHelper
                  (local_a0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/utils/RateLimiterTest.cpp"
                   ,0x37,local_88[0]);
        testing::internal::AssertHelper::operator=(local_a0,(Message *)&local_a8);
        testing::internal::AssertHelper::~AssertHelper(local_a0);
        if (local_88[0] != local_78) {
          operator_delete(local_88[0]);
        }
        if (local_a8 != (long *)0x0) {
          cVar2 = testing::internal::IsTrue(true);
          if ((cVar2 != '\0') && (local_a8 != (long *)0x0)) {
            (**(code **)(*local_a8 + 8))();
          }
          local_a8 = (long *)0x0;
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_90,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        uVar4 = extraout_XMM0_Da_06;
        uVar5 = extraout_XMM0_Db_06;
        if (!bVar1) {
          return;
        }
      }
      bVar1 = RateLimiter<jaegertracing::utils::(anonymous_namespace)::MockClock>::checkCredit
                        (&local_68,(double)CONCAT44(uVar5,uVar4));
      local_98[0] = !bVar1;
      local_90.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if ((bool)local_98[0]) {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_90,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        _ZN13jaegertracing5utils12_GLOBAL__N_111currentTimeE_0.__r = dVar3.__r + 5000000000;
        bVar1 = RateLimiter<jaegertracing::utils::(anonymous_namespace)::MockClock>::checkCredit
                          (&local_68,(double)CONCAT44(extraout_XMM0_Db_07,extraout_XMM0_Da_07));
        local_90.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        local_98[0] = bVar1;
        if (bVar1) {
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(&local_90,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                 );
          uVar4 = extraout_XMM0_Da_08;
          uVar5 = extraout_XMM0_Db_08;
        }
        else {
          testing::Message::Message((Message *)&local_a8);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((AssertionResult *)local_88,local_98,"limiter.checkCredit(1)","false");
          testing::internal::AssertHelper::AssertHelper
                    (local_a0,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/utils/RateLimiterTest.cpp"
                     ,0x3b,local_88[0]);
          testing::internal::AssertHelper::operator=(local_a0,(Message *)&local_a8);
          testing::internal::AssertHelper::~AssertHelper(local_a0);
          if (local_88[0] != local_78) {
            operator_delete(local_88[0]);
          }
          if (local_a8 != (long *)0x0) {
            cVar2 = testing::internal::IsTrue(true);
            if ((cVar2 != '\0') && (local_a8 != (long *)0x0)) {
              (**(code **)(*local_a8 + 8))();
            }
            local_a8 = (long *)0x0;
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(&local_90,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                 );
          uVar4 = extraout_XMM0_Da_09;
          uVar5 = extraout_XMM0_Db_09;
          if (!bVar1) {
            return;
          }
        }
        bVar1 = RateLimiter<jaegertracing::utils::(anonymous_namespace)::MockClock>::checkCredit
                          (&local_68,(double)CONCAT44(uVar5,uVar4));
        local_90.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        local_98[0] = bVar1;
        if (bVar1) {
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(&local_90,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                 );
          uVar4 = extraout_XMM0_Da_10;
          uVar5 = extraout_XMM0_Db_10;
        }
        else {
          testing::Message::Message((Message *)&local_a8);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((AssertionResult *)local_88,local_98,"limiter.checkCredit(1)","false");
          testing::internal::AssertHelper::AssertHelper
                    (local_a0,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/utils/RateLimiterTest.cpp"
                     ,0x3c,local_88[0]);
          testing::internal::AssertHelper::operator=(local_a0,(Message *)&local_a8);
          testing::internal::AssertHelper::~AssertHelper(local_a0);
          if (local_88[0] != local_78) {
            operator_delete(local_88[0]);
          }
          if (local_a8 != (long *)0x0) {
            cVar2 = testing::internal::IsTrue(true);
            if ((cVar2 != '\0') && (local_a8 != (long *)0x0)) {
              (**(code **)(*local_a8 + 8))();
            }
            local_a8 = (long *)0x0;
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(&local_90,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                 );
          uVar4 = extraout_XMM0_Da_11;
          uVar5 = extraout_XMM0_Db_11;
          if (!bVar1) {
            return;
          }
        }
        bVar1 = RateLimiter<jaegertracing::utils::(anonymous_namespace)::MockClock>::checkCredit
                          (&local_68,(double)CONCAT44(uVar5,uVar4));
        local_98[0] = !bVar1;
        local_90.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if ((bool)local_98[0]) {
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(&local_90,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                 );
          bVar1 = RateLimiter<jaegertracing::utils::(anonymous_namespace)::MockClock>::checkCredit
                            (&local_68,(double)CONCAT44(extraout_XMM0_Db_12,extraout_XMM0_Da_12));
          local_98[0] = !bVar1;
          local_90.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if ((bool)local_98[0]) {
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset(&local_90,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            bVar1 = RateLimiter<jaegertracing::utils::(anonymous_namespace)::MockClock>::checkCredit
                              (&local_68,(double)CONCAT44(extraout_XMM0_Db_13,extraout_XMM0_Da_13));
            local_98[0] = !bVar1;
            local_90.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
            ;
            if (!(bool)local_98[0]) {
              testing::Message::Message((Message *)&local_a8);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((AssertionResult *)local_88,local_98,"limiter.checkCredit(1)","true");
              testing::internal::AssertHelper::AssertHelper
                        (local_a0,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/utils/RateLimiterTest.cpp"
                         ,0x3f,local_88[0]);
              testing::internal::AssertHelper::operator=(local_a0,(Message *)&local_a8);
              testing::internal::AssertHelper::~AssertHelper(local_a0);
              if (local_88[0] != local_78) {
                operator_delete(local_88[0]);
              }
              if (local_a8 != (long *)0x0) {
                cVar2 = testing::internal::IsTrue(true);
                if ((cVar2 != '\0') && (local_a8 != (long *)0x0)) {
                  (**(code **)(*local_a8 + 8))();
                }
                local_a8 = (long *)0x0;
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset(&local_90,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          }
          else {
            testing::Message::Message((Message *)&local_a8);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((AssertionResult *)local_88,local_98,"limiter.checkCredit(1)","true");
            testing::internal::AssertHelper::AssertHelper
                      (local_a0,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/utils/RateLimiterTest.cpp"
                       ,0x3e,local_88[0]);
            testing::internal::AssertHelper::operator=(local_a0,(Message *)&local_a8);
            testing::internal::AssertHelper::~AssertHelper(local_a0);
            if (local_88[0] != local_78) {
              operator_delete(local_88[0]);
            }
            if (local_a8 != (long *)0x0) {
              cVar2 = testing::internal::IsTrue(true);
              if ((cVar2 != '\0') && (local_a8 != (long *)0x0)) {
                (**(code **)(*local_a8 + 8))();
              }
              local_a8 = (long *)0x0;
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset(&local_90,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          }
        }
        else {
          testing::Message::Message((Message *)&local_a8);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((AssertionResult *)local_88,local_98,"limiter.checkCredit(1)","true");
          testing::internal::AssertHelper::AssertHelper
                    (local_a0,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/utils/RateLimiterTest.cpp"
                     ,0x3d,local_88[0]);
          testing::internal::AssertHelper::operator=(local_a0,(Message *)&local_a8);
          testing::internal::AssertHelper::~AssertHelper(local_a0);
          if (local_88[0] != local_78) {
            operator_delete(local_88[0]);
          }
          if (local_a8 != (long *)0x0) {
            cVar2 = testing::internal::IsTrue(true);
            if ((cVar2 != '\0') && (local_a8 != (long *)0x0)) {
              (**(code **)(*local_a8 + 8))();
            }
            local_a8 = (long *)0x0;
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(&local_90,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                 );
        }
      }
      else {
        testing::Message::Message((Message *)&local_a8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((AssertionResult *)local_88,local_98,"limiter.checkCredit(1)","true");
        testing::internal::AssertHelper::AssertHelper
                  (local_a0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/utils/RateLimiterTest.cpp"
                   ,0x38,local_88[0]);
        testing::internal::AssertHelper::operator=(local_a0,(Message *)&local_a8);
        testing::internal::AssertHelper::~AssertHelper(local_a0);
        if (local_88[0] != local_78) {
          operator_delete(local_88[0]);
        }
        if (local_a8 != (long *)0x0) {
          cVar2 = testing::internal::IsTrue(true);
          if ((cVar2 != '\0') && (local_a8 != (long *)0x0)) {
            (**(code **)(*local_a8 + 8))();
          }
          local_a8 = (long *)0x0;
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_90,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      }
    }
    else {
      testing::Message::Message((Message *)&local_a8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)local_88,local_98,"limiter.checkCredit(1)","true");
      testing::internal::AssertHelper::AssertHelper
                (local_a0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/utils/RateLimiterTest.cpp"
                 ,0x34,local_88[0]);
      testing::internal::AssertHelper::operator=(local_a0,(Message *)&local_a8);
      testing::internal::AssertHelper::~AssertHelper(local_a0);
      if (local_88[0] != local_78) {
        operator_delete(local_88[0]);
      }
      if (local_a8 != (long *)0x0) {
        cVar2 = testing::internal::IsTrue(true);
        if ((cVar2 != '\0') && (local_a8 != (long *)0x0)) {
          (**(code **)(*local_a8 + 8))();
        }
        local_a8 = (long *)0x0;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_90,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
  }
  else {
    testing::Message::Message((Message *)&local_a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_88,local_98,"limiter.checkCredit(1)","true");
    testing::internal::AssertHelper::AssertHelper
              (local_a0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/utils/RateLimiterTest.cpp"
               ,0x31,local_88[0]);
    testing::internal::AssertHelper::operator=(local_a0,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(local_a0);
    if (local_88[0] != local_78) {
      operator_delete(local_88[0]);
    }
    if (local_a8 != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_a8 != (long *)0x0)) {
        (**(code **)(*local_a8 + 8))();
      }
      local_a8 = (long *)0x0;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_90,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  return;
}

Assistant:

TEST(RateLimiter, testRateLimiter)
{
    const auto timestamp = std::chrono::steady_clock::now();
    currentTime = timestamp;
    RateLimiter<MockClock> limiter(2, 2);

    ASSERT_TRUE(limiter.checkCredit(1));
    ASSERT_TRUE(limiter.checkCredit(1));
    ASSERT_FALSE(limiter.checkCredit(1));

    currentTime = timestamp + std::chrono::milliseconds(250);
    ASSERT_FALSE(limiter.checkCredit(1));

    currentTime = timestamp + std::chrono::milliseconds(750);
    ASSERT_TRUE(limiter.checkCredit(1));
    ASSERT_FALSE(limiter.checkCredit(1));

    currentTime = timestamp + std::chrono::seconds(5);
    ASSERT_TRUE(limiter.checkCredit(1));
    ASSERT_TRUE(limiter.checkCredit(1));
    ASSERT_FALSE(limiter.checkCredit(1));
    ASSERT_FALSE(limiter.checkCredit(1));
    ASSERT_FALSE(limiter.checkCredit(1));
}